

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSNamespaceItem.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XSNamespaceItem::~XSNamespaceItem(XSNamespaceItem *this)

{
  XSNamedMap<xercesc_4_0::XSObject> *this_00;
  RefHashTableOf<xercesc_4_0::XSObject,_xercesc_4_0::StringHasher> *this_01;
  void *in_RSI;
  XMLSize_t i;
  ulong uVar1;
  
  uVar1 = 0;
  do {
    if ((uVar1 < 0xb) && ((0x437UL >> (uVar1 & 0x3f) & 1) != 0)) {
      this_00 = this->fComponentMap[uVar1];
      if (this_00 != (XSNamedMap<xercesc_4_0::XSObject> *)0x0) {
        XSNamedMap<xercesc_4_0::XSObject>::~XSNamedMap(this_00);
      }
      XMemory::operator_delete((XMemory *)this_00,in_RSI);
      this_01 = this->fHashMap[uVar1];
      if (this_01 != (RefHashTableOf<xercesc_4_0::XSObject,_xercesc_4_0::StringHasher> *)0x0) {
        RefHashTableOf<xercesc_4_0::XSObject,_xercesc_4_0::StringHasher>::~RefHashTableOf(this_01);
      }
      XMemory::operator_delete((XMemory *)this_01,in_RSI);
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0xe);
  if (this->fXSAnnotationList != (XSAnnotationList *)0x0) {
    (*(this->fXSAnnotationList->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).
      _vptr_BaseRefVectorOf[1])();
    return;
  }
  return;
}

Assistant:

XSNamespaceItem::~XSNamespaceItem()
{
    for (XMLSize_t i=0; i<XSConstants::MULTIVALUE_FACET; i++)
    {
        switch (i+1)
        {
            case XSConstants::ATTRIBUTE_DECLARATION:
            case XSConstants::ELEMENT_DECLARATION:
            case XSConstants::TYPE_DEFINITION:
            case XSConstants::ATTRIBUTE_GROUP_DEFINITION:
            case XSConstants::MODEL_GROUP_DEFINITION:
            case XSConstants::NOTATION_DECLARATION:
                delete fComponentMap[i];
                delete fHashMap[i];
                break;
        }
    }

    delete fXSAnnotationList;
}